

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue.cpp
# Opt level: O3

QCborValue *
QCborValue::fromCbor(QCborValue *__return_storage_ptr__,QByteArray *ba,QCborParserError *error)

{
  QCborError QVar1;
  qint64 qVar2;
  long in_FS_OFFSET;
  undefined1 local_48 [32];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_48._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QCborStreamReader::QCborStreamReader((QCborStreamReader *)local_48,ba);
  *(undefined1 **)&__return_storage_ptr__->t = &DAT_aaaaaaaaaaaaaaaa;
  __return_storage_ptr__->n = (qint64)&DAT_aaaaaaaaaaaaaaaa;
  __return_storage_ptr__->container = (QCborContainerPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  fromCbor(__return_storage_ptr__,(QCborStreamReader *)local_48);
  if (error != (QCborParserError *)0x0) {
    QVar1 = QCborStreamReader::lastError((QCborStreamReader *)local_48);
    (error->error).c = QVar1.c;
    qVar2 = QCborStreamReader::currentOffset((QCborStreamReader *)local_48);
    error->offset = qVar2;
  }
  QCborStreamReader::~QCborStreamReader((QCborStreamReader *)local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QCborValue QCborValue::fromCbor(const QByteArray &ba, QCborParserError *error)
{
    QCborStreamReader reader(ba);
    QCborValue result = fromCbor(reader);
    if (error) {
        error->error = reader.lastError();
        error->offset = reader.currentOffset();
    }
    return result;
}